

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

void __thiscall ON_Displacement::ON_Displacement(ON_Displacement *this,ON_XMLNode *dsp_node)

{
  ON_SimpleArray<ON_Displacement::SubItem_*> *this_00;
  bool bVar1;
  int iVar2;
  CImplDSP *pCVar3;
  undefined4 extraout_var;
  wchar_t *name;
  ON_XMLNode *pOVar4;
  undefined4 extraout_var_00;
  SubItem *this_01;
  ON_XMLNode *this_02;
  SubItem *local_130;
  ChildIterator it;
  ON_XMLNode new_dsp_node;
  
  ON_MeshModifier::ON_MeshModifier(&this->super_ON_MeshModifier);
  (this->super_ON_MeshModifier)._vptr_ON_MeshModifier = (_func_int **)&PTR__ON_Displacement_00826538
  ;
  pCVar3 = (CImplDSP *)operator_new(0x18);
  (pCVar3->m_subs)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00826d08;
  (pCVar3->m_subs).m_a = (SubItem **)0x0;
  (pCVar3->m_subs).m_count = 0;
  (pCVar3->m_subs).m_capacity = 0;
  this->m_impl_dsp = pCVar3;
  iVar2 = (*dsp_node->_vptr_ON_XMLNode[3])(dsp_node);
  name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar2));
  ON_XMLNode::ON_XMLNode(&new_dsp_node,name);
  (*dsp_node->_vptr_ON_XMLNode[0x2c])(&it,dsp_node);
  while( true ) {
    pOVar4 = ON_XMLNode::ChildIterator::GetNextChild(&it);
    if (pOVar4 == (ON_XMLNode *)0x0) break;
    iVar2 = (*pOVar4->_vptr_ON_XMLNode[3])(pOVar4);
    bVar1 = ::operator==(L"sub",(ON_wString *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      this_00 = &this->m_impl_dsp->m_subs;
      this_01 = (SubItem *)operator_new(8);
      SubItem::SubItem(this_01,pOVar4);
      local_130 = this_01;
      ON_SimpleArray<ON_Displacement::SubItem_*>::Append(this_00,&local_130);
    }
    else {
      this_02 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(this_02,pOVar4);
      ON_XMLNode::AttachChildNode(&new_dsp_node,this_02);
    }
  }
  pOVar4 = ON_InternalXMLImpl::Node
                     (&((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl);
  ON_XMLNode::operator=(pOVar4,&new_dsp_node);
  ON_XMLNode::ChildIterator::~ChildIterator(&it);
  ON_XMLRootNode::~ON_XMLRootNode((ON_XMLRootNode *)&new_dsp_node);
  return;
}

Assistant:

ON_Displacement::ON_Displacement(const ON_XMLNode& dsp_node)
{
  m_impl_dsp = new CImplDSP;

  // Iterate over the displacement node looking at each child node's name. If the child
  // node is a sub-item node, create a sub-item object to hold the sub-item XML. Otherwise add
  // a copy of the child node to a new displacement node.
  ON_XMLNode new_dsp_node(dsp_node.TagName());

  auto it = dsp_node.GetChildIterator();
  while (ON_XMLNode* child_node = it.GetNextChild())
  {
    if (ON_DISPLACEMENT_SUB == child_node->TagName())
    {
      m_impl_dsp->m_subs.Append(new SubItem(*child_node));
    }
    else
    {
      new_dsp_node.AttachChildNode(new ON_XMLNode(*child_node));
    }
  }

  // Copy the new displacement node to our node. It only contains displacement XML with no sub-item nodes.
  m_impl->Node() = new_dsp_node;
}